

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_upsert.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
__thiscall
duckdb::Transformer::TransformConflictTarget_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *__return_storage_ptr__,Transformer *this,PGList *list)

{
  PGIndexElem *pPVar1;
  NotImplementedException *pNVar2;
  allocator local_49;
  string local_48;
  optional_ptr<duckdb_libpgquery::PGIndexElem,_true> index_element;
  
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    list = (PGList *)list->head;
    if (list == (PGList *)0x0) {
      return __return_storage_ptr__;
    }
    index_element.ptr = *(PGIndexElem **)list;
    pPVar1 = optional_ptr<duckdb_libpgquery::PGIndexElem,_true>::operator->(&index_element);
    if (pPVar1->collation != (PGList *)0x0) {
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,"Index with collation not supported yet!",&local_49);
      NotImplementedException::NotImplementedException(pNVar2,&local_48);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pPVar1 = optional_ptr<duckdb_libpgquery::PGIndexElem,_true>::operator->(&index_element);
    if (pPVar1->opclass != (PGList *)0x0) {
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,"Index with opclass not supported yet!",&local_49);
      NotImplementedException::NotImplementedException(pNVar2,&local_48);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pPVar1 = optional_ptr<duckdb_libpgquery::PGIndexElem,_true>::operator->(&index_element);
    if (pPVar1->name == (char *)0x0) break;
    pPVar1 = optional_ptr<duckdb_libpgquery::PGIndexElem,_true>::operator->(&index_element);
    if (pPVar1->nulls_ordering != PG_SORTBY_NULLS_DEFAULT) {
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,"Index with null_ordering not supported yet!",&local_49);
      NotImplementedException::NotImplementedException(pNVar2,&local_48);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pPVar1 = optional_ptr<duckdb_libpgquery::PGIndexElem,_true>::operator->(&index_element);
    if (pPVar1->ordering != PG_SORTBY_DEFAULT) {
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,"Index with ordering not supported yet!",&local_49);
      NotImplementedException::NotImplementedException(pNVar2,&local_48);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pPVar1 = optional_ptr<duckdb_libpgquery::PGIndexElem,_true>::operator->(&index_element);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&pPVar1->name);
  }
  pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,"Non-column index element not supported yet!",&local_49);
  NotImplementedException::NotImplementedException(pNVar2,&local_48);
  __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

vector<string> Transformer::TransformConflictTarget(duckdb_libpgquery::PGList &list) {
	vector<string> columns;
	for (auto cell = list.head; cell != nullptr; cell = cell->next) {
		auto index_element = PGPointerCast<duckdb_libpgquery::PGIndexElem>(cell->data.ptr_value);
		if (index_element->collation) {
			throw NotImplementedException("Index with collation not supported yet!");
		}
		if (index_element->opclass) {
			throw NotImplementedException("Index with opclass not supported yet!");
		}
		if (!index_element->name) {
			throw NotImplementedException("Non-column index element not supported yet!");
		}
		if (index_element->nulls_ordering) {
			throw NotImplementedException("Index with null_ordering not supported yet!");
		}
		if (index_element->ordering) {
			throw NotImplementedException("Index with ordering not supported yet!");
		}
		columns.emplace_back(index_element->name);
	}
	return columns;
}